

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cc
# Opt level: O0

Point * __thiscall p2t::Triangle::PointCW(Triangle *this,Point *point)

{
  Point *point_local;
  Triangle *this_local;
  
  if (point == this->points_[0]) {
    this_local = (Triangle *)this->points_[2];
  }
  else if (point == this->points_[1]) {
    this_local = (Triangle *)this->points_[0];
  }
  else {
    if (point != this->points_[2]) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/contrib/poly2tri/poly2tri/common/shapes.cc"
                    ,0xde,"Point *p2t::Triangle::PointCW(const Point &)");
    }
    this_local = (Triangle *)this->points_[1];
  }
  return (Point *)this_local;
}

Assistant:

Point* Triangle::PointCW(const Point& point)
{
  if (&point == points_[0]) {
    return points_[2];
  } else if (&point == points_[1]) {
    return points_[0];
  } else if (&point == points_[2]) {
    return points_[1];
  }
  assert(0);
  return NULL;
}